

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O0

bool __thiscall OpenMD::StringTokenizer::hasMoreTokens(StringTokenizer *this)

{
  bool bVar1;
  StringTokenizer *in_RDI;
  const_iterator i;
  uint7 in_stack_ffffffffffffffd8;
  char in_stack_ffffffffffffffdf;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18 [2];
  bool local_1;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)in_RDI,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
  if (bVar1) {
    local_1 = false;
  }
  else if ((in_RDI->returnTokens_ & 1U) == 0) {
    local_18[0]._M_current = (in_RDI->currentPos_)._M_current;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)in_RDI,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffdf = false;
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(local_18);
        in_stack_ffffffffffffffdf = isDelimiter(in_RDI,in_stack_ffffffffffffffdf);
      }
      if ((bool)in_stack_ffffffffffffffdf == false) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(local_18);
    }
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)(ulong)in_stack_ffffffffffffffd8);
    local_1 = (bool)(-bVar1 & 1);
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StringTokenizer::hasMoreTokens() {
    if (currentPos_ == end_) {
      return false;
    } else if (returnTokens_) {
      return true;
    } else {
      std::string::const_iterator i = currentPos_;

      // walk through the remaining string to check whether it contains
      // non-delimeter or not
      while (i != end_ && isDelimiter(*i)) {
        ++i;
      }

      return i != end_ ? true : false;
    }
  }